

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

MontyContext * monty_new(mp_int *modulus)

{
  size_t nw;
  BignumInt *__src;
  ulong uVar1;
  ulong uVar2;
  MontyContext *pMVar3;
  mp_int *pmVar4;
  mp_int *n;
  mp_int *r_out;
  ulong uVar5;
  long lVar6;
  mp_int local_30;
  
  pMVar3 = (MontyContext *)safemalloc(1,0x48,0);
  nw = modulus->nw;
  pMVar3->rw = nw;
  pMVar3->rbits = nw << 6;
  pMVar3->pw = nw * 2 | 1;
  __src = modulus->w;
  pmVar4 = mp_make_sized(nw);
  memcpy(pmVar4->w,__src,pmVar4->nw << 3);
  pMVar3->m = pmVar4;
  pmVar4 = mp_invert_mod_2to(pmVar4,pMVar3->rbits);
  pMVar3->minus_minv_mod_r = pmVar4;
  local_30.nw = 0;
  mp_add_masked_into(pmVar4->w,pmVar4->nw,&local_30,pmVar4,0xffffffffffffffff,0xffffffffffffffff,1);
  n = mp_make_sized(pMVar3->rw + 1);
  n->w[pMVar3->rw] = 1;
  pmVar4 = pMVar3->m;
  r_out = mp_make_sized(pmVar4->nw);
  mp_divmod_into(n,pmVar4,(mp_int *)0x0,r_out);
  pMVar3->powers_of_r_mod_m[0] = r_out;
  mp_free(n);
  lVar6 = 6;
  do {
    pmVar4 = mp_modmul(pMVar3->powers_of_r_mod_m[0],pMVar3->powers_of_r_mod_m[lVar6 + -6],pMVar3->m)
    ;
    pMVar3->powers_of_r_mod_m[lVar6 + -5] = pmVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  uVar1 = pMVar3->rw;
  uVar2 = pMVar3->pw;
  uVar5 = uVar1;
  if (uVar2 < uVar1) {
    uVar5 = uVar2;
  }
  pmVar4 = mp_make_sized(uVar1 * 3 + uVar2 + uVar5 * 6);
  pMVar3->scratch = pmVar4;
  return pMVar3;
}

Assistant:

MontyContext *monty_new(mp_int *modulus)
{
    MontyContext *mc = snew(MontyContext);

    mc->rw = modulus->nw;
    mc->rbits = mc->rw * BIGNUM_INT_BITS;
    mc->pw = mc->rw * 2 + 1;

    mc->m = mp_copy(modulus);

    mc->minus_minv_mod_r = mp_invert_mod_2to(mc->m, mc->rbits);
    mp_neg_into(mc->minus_minv_mod_r, mc->minus_minv_mod_r);

    mp_int *r = mp_make_sized(mc->rw + 1);
    r->w[mc->rw] = 1;
    mc->powers_of_r_mod_m[0] = mp_mod(r, mc->m);
    mp_free(r);

    for (size_t j = 1; j < lenof(mc->powers_of_r_mod_m); j++)
        mc->powers_of_r_mod_m[j] = mp_modmul(
            mc->powers_of_r_mod_m[0], mc->powers_of_r_mod_m[j-1], mc->m);

    mc->scratch = mp_make_sized(monty_scratch_size(mc));

    return mc;
}